

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

object_ptr __thiscall mjs::object::get_accessor_property_object(object *this,wstring_view name)

{
  bool bVar1;
  logic_error *this_00;
  wchar_t *in_RCX;
  undefined8 extraout_RDX;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar2;
  object_ptr oVar3;
  wstring_view key;
  value local_40;
  
  key._M_str = in_RCX;
  key._M_len = (size_t)name._M_str;
  pVar2 = find((object *)name._M_len,key);
  bVar1 = has_attributes((pVar2.first)->attributes_,accessor);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"get_accessor_property_fields called on non-accessor property");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  value_representation::get_value(&local_40,&(pVar2.first)->value_,((object *)name._M_len)->heap_);
  if (local_40.type_ == object) {
    this->_vptr_object = (_func_int **)local_40.field_1.n_;
    *(uint32_t *)&this->heap_ =
         local_40.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
    if (local_40.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
        (gc_heap *)0x0) {
      gc_heap::attach(local_40.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.
                      super_gc_heap_ptr_untyped.heap_,(gc_heap_ptr_untyped *)this);
    }
    value::destroy(&local_40);
    oVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    oVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
    return (object_ptr)oVar3.super_gc_heap_ptr_untyped;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

object_ptr object::get_accessor_property_object(const std::wstring_view name) {
    auto it = find(name).first;
    if (!has_attributes(it->attributes(), property_attribute::accessor)) {
        throw std::logic_error{"get_accessor_property_fields called on non-accessor property"};
    }
    return it->raw_get(heap_).object_value();
}